

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O2

size_t anon_unknown.dwarf_2b6e94::parent_path_end(StringRef path,Style style)

{
  char cVar1;
  size_t sVar2;
  size_t sVar3;
  Style in_ECX;
  bool bVar4;
  undefined4 in_register_00000014;
  ulong uVar5;
  StringRef str;
  StringRef str_00;
  StringRef local_40;
  
  str.Length._4_4_ = in_register_00000014;
  str.Length._0_4_ = style;
  str.Data = (char *)path.Length;
  local_40.Data = path.Data;
  local_40.Length = (size_t)str.Data;
  sVar2 = filename_pos((anon_unknown_dwarf_2b6e94 *)local_40.Data,str,in_ECX);
  if (str.Data == (char *)0x0) {
    bVar4 = false;
  }
  else {
    cVar1 = llvm::StringRef::operator[](&local_40,sVar2);
    bVar4 = true;
    if (cVar1 != '/') {
      in_ECX = CONCAT31((int3)(in_ECX >> 8),style == windows);
      bVar4 = cVar1 == '\\' && style == windows;
    }
  }
  str_00.Length._0_4_ = style;
  str_00.Data = (char *)local_40.Length;
  str_00.Length._4_4_ = 0;
  sVar3 = root_dir_start((anon_unknown_dwarf_2b6e94 *)local_40.Data,str_00,in_ECX);
  do {
    uVar5 = sVar2;
    if ((uVar5 == 0) || (sVar3 != 0xffffffffffffffff && uVar5 <= sVar3)) break;
    sVar2 = uVar5 - 1;
    cVar1 = llvm::StringRef::operator[](&local_40,sVar2);
  } while ((cVar1 == '/') || (style == windows && cVar1 == '\\'));
  sVar2 = sVar3 + 1;
  if (sVar3 != uVar5) {
    sVar2 = uVar5;
  }
  if (bVar4) {
    sVar2 = uVar5;
  }
  return sVar2;
}

Assistant:

size_t parent_path_end(StringRef path, Style style) {
    size_t end_pos = filename_pos(path, style);

    bool filename_was_sep =
        path.size() > 0 && is_separator(path[end_pos], style);

    // Skip separators until we reach root dir (or the start of the string).
    size_t root_dir_pos = root_dir_start(path, style);
    while (end_pos > 0 &&
           (root_dir_pos == StringRef::npos || end_pos > root_dir_pos) &&
           is_separator(path[end_pos - 1], style))
      --end_pos;

    if (end_pos == root_dir_pos && !filename_was_sep) {
      // We've reached the root dir and the input path was *not* ending in a
      // sequence of slashes. Include the root dir in the parent path.
      return root_dir_pos + 1;
    }

    // Otherwise, just include before the last slash.
    return end_pos;
  }